

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_constant_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundConstantExpression::Copy(BoundConstantExpression *this)

{
  BoundConstantExpression *this_00;
  pointer this_01;
  pointer *__ptr;
  Expression *in_RSI;
  _Head_base<0UL,_duckdb::BoundConstantExpression_*,_false> local_68;
  Value local_60;
  
  this_00 = (BoundConstantExpression *)operator_new(0x98);
  Value::Value(&local_60,(Value *)(in_RSI + 1));
  BoundConstantExpression(this_00,&local_60);
  local_68._M_head_impl = this_00;
  Value::~Value(&local_60);
  this_01 = unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                          *)&local_68);
  Expression::CopyProperties(&this_01->super_Expression,in_RSI);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_68._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundConstantExpression::Copy() const {
	auto copy = make_uniq<BoundConstantExpression>(value);
	copy->CopyProperties(*this);
	return std::move(copy);
}